

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O2

void __thiscall pktalloc::Allocator::~Allocator(Allocator *this)

{
  uint uVar1;
  WindowHeader *pWVar2;
  uint uVar3;
  
  uVar1 = (this->PreferredWindows).Size;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    pWVar2 = (this->PreferredWindows).DataPtr[(int)uVar3];
    if ((pWVar2 != (WindowHeader *)0x0) && (pWVar2->Preallocated == false)) {
      SIMDSafeFree(pWVar2);
    }
  }
  uVar1 = (this->FullWindows).Size;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    pWVar2 = (this->FullWindows).DataPtr[(int)uVar3];
    if ((pWVar2 != (WindowHeader *)0x0) && (pWVar2->Preallocated == false)) {
      SIMDSafeFree(pWVar2);
    }
  }
  SIMDSafeFree(this->HugeChunkStart);
  return;
}

Assistant:

Allocator::~Allocator()
{
    for (unsigned i = 0, count = PreferredWindows.GetSize(); i < count; ++i)
    {
        WindowHeader* window = PreferredWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window != nullptr);
        if (window && !window->Preallocated) {
            SIMDSafeFree(window);
        }
    }
    for (unsigned i = 0, count = FullWindows.GetSize(); i < count; ++i)
    {
        WindowHeader* window = FullWindows.GetRef(i);
        PKTALLOC_DEBUG_ASSERT(window != nullptr);
        if (window && !window->Preallocated) {
            SIMDSafeFree(window);
        }
    }
    SIMDSafeFree(HugeChunkStart);
}